

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

int filter_lookup(filter **filt,kqueue *kq,short id)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = 0x16;
  if (0xfff3 < (ushort)id) {
    *filt = (filter *)((long)&kq->kq_filt[0].kf_id + (ulong)((~(uint)(ushort)id & 0xffff) * 0xa0));
    if (*(long *)((long)&kq->kq_filt[0].kf_copyout + (ulong)((~(uint)(ushort)id & 0xffff) * 0xa0))
        != 0) {
      return 0;
    }
    iVar2 = 0x26;
  }
  piVar1 = __errno_location();
  *piVar1 = iVar2;
  *filt = (filter *)0x0;
  return -1;
}

Assistant:

int
filter_lookup(struct filter **filt, struct kqueue *kq, short id)
{
    if (~id < 0 || ~id >= EVFILT_SYSCOUNT) {
        dbg_printf("filt=%d inv_filt=%d - invalid id", id, (~id));
        errno = EINVAL;
        *filt = NULL;
        return (-1);
    }
    *filt = &kq->kq_filt[~id];
    if ((*filt)->kf_copyout == NULL) {
        dbg_printf("filt=%d - filt_name=%s not implemented", id, filter_name(id));
        errno = ENOSYS;
        *filt = NULL;
        return (-1);
    }

    return (0);
}